

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkDivisors_rec(Acb_Ntk_t *p,int iObj,int nTfiLevMin,Vec_Int_t *vDivs)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  iVar1 = Acb_ObjIsCi(p,iObj);
  if ((-1 < nTfiLevMin) || (iVar1 != 0)) {
    iVar1 = Acb_ObjSetTravIdCur(p,iObj);
    if (iVar1 == 0) {
      piVar2 = Acb_ObjFanins(p,iObj);
      for (lVar3 = 0; lVar3 < *piVar2; lVar3 = lVar3 + 1) {
        Acb_NtkDivisors_rec(p,piVar2[lVar3 + 1],nTfiLevMin + -1,vDivs);
      }
      Vec_IntPush(vDivs,iObj);
      return;
    }
  }
  return;
}

Assistant:

void Acb_NtkDivisors_rec( Acb_Ntk_t * p, int iObj, int nTfiLevMin, Vec_Int_t * vDivs )
{
    int k, iFanin, * pFanins;
//    if ( !Acb_ObjIsCi(p, iObj) && Acb_ObjLevelD(p, iObj) < nTfiLevMin )
    if ( !Acb_ObjIsCi(p, iObj) && nTfiLevMin < 0 )
        return;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Acb_NtkDivisors_rec( p, iFanin, nTfiLevMin-1, vDivs );
    Vec_IntPush( vDivs, iObj );
}